

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall
CharFieldSourceByteArray::CharFieldSourceByteArray(CharFieldSourceByteArray *this,vm_obj_id_t id)

{
  CVmObject *pCVar1;
  _func_int **pp_Var2;
  CharFieldSource *in_RDI;
  
  CharFieldSource::CharFieldSource(in_RDI);
  in_RDI->_vptr_CharFieldSource = (_func_int **)&PTR__CharFieldSourceByteArray_003e7e78;
  pCVar1 = vm_objp(0);
  in_RDI[1]._vptr_CharFieldSource = (_func_int **)pCVar1;
  in_RDI[2]._vptr_CharFieldSource = (_func_int **)0x0;
  pp_Var2 = (_func_int **)CVmObjByteArray::get_element_count((CVmObjByteArray *)0x329e9a);
  in_RDI[3]._vptr_CharFieldSource = pp_Var2;
  return;
}

Assistant:

CharFieldSourceByteArray(VMG_ vm_obj_id_t id)
    {
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);
        idx = 0;
        len = arr->get_element_count();
    }